

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateConstructorAccess
          (ExpressionContext *ctx,SynBase *source,ArrayView<FunctionData_*> functions,
          ExprBase *context)

{
  TypeFunction *type_00;
  IntrusiveList<FunctionHandle> functions_00;
  uint uVar1;
  uint uVar2;
  FunctionData **ppFVar3;
  FunctionHandle *this;
  ExprFunctionOverloadSet *this_00;
  ExprFunctionAccess *this_01;
  ArrayView<TypeBase_*> setTypes;
  ArrayView<TypeBase*> local_118 [16];
  TypeFunctionSet *local_108;
  TypeFunctionSet *type;
  FunctionData *local_f8;
  FunctionData *curr;
  uint i;
  undefined1 auStack_e0 [8];
  IntrusiveList<FunctionHandle> handles;
  SmallArray<TypeBase_*,_16U> types;
  ExprBase *context_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<FunctionData_*> functions_local;
  
  ctx_local = (ExpressionContext *)functions.data;
  functions_local.data._0_4_ = functions.count;
  uVar1 = ArrayView<FunctionData_*>::size((ArrayView<FunctionData_*> *)&ctx_local);
  if (uVar1 < 2) {
    this_01 = ExpressionContext::get<ExprFunctionAccess>(ctx);
    ppFVar3 = ArrayView<FunctionData_*>::operator[]((ArrayView<FunctionData_*> *)&ctx_local,0);
    type_00 = (*ppFVar3)->type;
    ppFVar3 = ArrayView<FunctionData_*>::operator[]((ArrayView<FunctionData_*> *)&ctx_local,0);
    ExprFunctionAccess::ExprFunctionAccess(this_01,source,&type_00->super_TypeBase,*ppFVar3,context)
    ;
    functions_local._8_8_ = this_01;
  }
  else {
    SmallArray<TypeBase_*,_16U>::SmallArray
              ((SmallArray<TypeBase_*,_16U> *)&handles.tail,ctx->allocator);
    IntrusiveList<FunctionHandle>::IntrusiveList((IntrusiveList<FunctionHandle> *)auStack_e0);
    curr._0_4_ = 0;
    while( true ) {
      uVar1 = (uint)curr;
      uVar2 = ArrayView<FunctionData_*>::size((ArrayView<FunctionData_*> *)&ctx_local);
      if (uVar2 <= uVar1) break;
      ppFVar3 = ArrayView<FunctionData_*>::operator[]
                          ((ArrayView<FunctionData_*> *)&ctx_local,(uint)curr);
      local_f8 = *ppFVar3;
      type = (TypeFunctionSet *)local_f8->type;
      SmallArray<TypeBase_*,_16U>::push_back
                ((SmallArray<TypeBase_*,_16U> *)&handles.tail,(TypeBase **)&type);
      this = ExpressionContext::get<FunctionHandle>(ctx);
      FunctionHandle::FunctionHandle(this,local_f8);
      IntrusiveList<FunctionHandle>::push_back((IntrusiveList<FunctionHandle> *)auStack_e0,this);
      curr._0_4_ = (uint)curr + 1;
    }
    ArrayView<TypeBase*>::ArrayView<16u>(local_118,(SmallArray<TypeBase_*,_16U> *)&handles.tail);
    setTypes._12_4_ = 0;
    setTypes._0_12_ = local_118._0_12_;
    local_108 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    this_00 = ExpressionContext::get<ExprFunctionOverloadSet>(ctx);
    functions_00.tail = handles.head;
    functions_00.head = (FunctionHandle *)auStack_e0;
    ExprFunctionOverloadSet::ExprFunctionOverloadSet
              (this_00,source,&local_108->super_TypeBase,functions_00,context);
    functions_local._8_8_ = this_00;
    SmallArray<TypeBase_*,_16U>::~SmallArray((SmallArray<TypeBase_*,_16U> *)&handles.tail);
  }
  return (ExprBase *)functions_local._8_8_;
}

Assistant:

ExprBase* CreateConstructorAccess(ExpressionContext &ctx, SynBase *source, ArrayView<FunctionData*> functions, ExprBase *context)
{
	if(functions.size() > 1)
	{
		SmallArray<TypeBase*, 16> types(ctx.allocator);
		IntrusiveList<FunctionHandle> handles;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			FunctionData *curr = functions[i];

			types.push_back(curr->type);
			handles.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(curr));
		}

		TypeFunctionSet *type = ctx.GetFunctionSetType(types);

		return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, handles, context);
	}

	return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, functions[0]->type, functions[0], context);
}